

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

void prf_node_destroy(prf_node_t *node)

{
  void *in_RDI;
  
  if (in_RDI != (void *)0x0) {
    if (*(long *)((long)in_RDI + 8) != 0) {
      free(*(void **)((long)in_RDI + 8));
    }
    if (*(long *)((long)in_RDI + 0x10) != 0) {
      prf_array_free((void *)0x10562c);
    }
    free(in_RDI);
  }
  return;
}

Assistant:

void
prf_node_destroy(
    prf_node_t * node )
{
    if ( node != NULL ) {
        if ( node->data )
            free( node->data );
        if ( node->children )
            prf_array_free( node->children );
        free( node );
    }
}